

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::FboRenderTestGroup::init(FboRenderTestGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestCaseGroup *pTVar1;
  TestNode *node;
  TestNode *pTVar2;
  TestCaseGroup *repeatedClearGroup;
  TestCaseGroup *texSubImageGroup;
  TestCaseGroup *stencilGroup;
  TestCaseGroup *depthGroup;
  TestCaseGroup *colorGroup;
  FboRenderTestGroup *this_local;
  
  anon_unknown_13::createChildGroup<deqp::gles2::Functional::FboCases::ColorClearsTest>
            (&this->super_TestCaseGroup,"color_clear","Color buffer clears");
  anon_unknown_13::createChildGroup<deqp::gles2::Functional::FboCases::StencilClearsTest>
            (&this->super_TestCaseGroup,"stencil_clear","Stencil buffer clears");
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_context,"color","Color buffer tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  anon_unknown_13::addChildVariants<deqp::gles2::Functional::FboCases::MixTest>(pTVar1);
  anon_unknown_13::addChildVariants<deqp::gles2::Functional::FboCases::MixNpotTest>(pTVar1);
  anon_unknown_13::addChildVariants<deqp::gles2::Functional::FboCases::BlendTest>(pTVar1);
  anon_unknown_13::addChildVariants<deqp::gles2::Functional::FboCases::BlendNpotTest>(pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_context,"depth","Depth bufer tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  anon_unknown_13::addChildVariants<deqp::gles2::Functional::FboCases::IntersectingQuadsTest>
            (pTVar1);
  anon_unknown_13::addChildVariants<deqp::gles2::Functional::FboCases::IntersectingQuadsNpotTest>
            (pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_context,"stencil","Stencil buffer tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  anon_unknown_13::addChildVariants<deqp::gles2::Functional::FboCases::StencilTest>(pTVar1);
  anon_unknown_13::addChildVariants<deqp::gles2::Functional::FboCases::StencilNpotTest>(pTVar1);
  anon_unknown_13::createChildGroup<deqp::gles2::Functional::FboCases::SharedColorbufferClearsTest>
            (&this->super_TestCaseGroup,"shared_colorbuffer_clear","Shared colorbuffer clears");
  anon_unknown_13::createChildGroup<deqp::gles2::Functional::FboCases::SharedColorbufferTest>
            (&this->super_TestCaseGroup,"shared_colorbuffer","Shared colorbuffer tests");
  anon_unknown_13::createChildGroup<deqp::gles2::Functional::FboCases::SharedDepthbufferTest>
            (&this->super_TestCaseGroup,"shared_depthbuffer","Shared depthbuffer tests");
  anon_unknown_13::createChildGroup<deqp::gles2::Functional::FboCases::ResizeTest>
            (&this->super_TestCaseGroup,"resize","FBO resize tests");
  Functional::(anonymous_namespace)::createRecreateBuffersGroup<16384u>
            (&this->super_TestCaseGroup,"recreate_colorbuffer","Recreate colorbuffer tests");
  Functional::(anonymous_namespace)::createRecreateBuffersGroup<256u>
            (&this->super_TestCaseGroup,"recreate_depthbuffer","Recreate depthbuffer tests");
  Functional::(anonymous_namespace)::createRecreateBuffersGroup<1024u>
            (&this->super_TestCaseGroup,"recreate_stencilbuffer","Recreate stencilbuffer tests");
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_context,"texsubimage",
             "TexSubImage interop with FBO colorbuffer texture");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  anon_unknown_13::addChildVariants<deqp::gles2::Functional::FboCases::TexSubImageAfterRenderTest>
            (pTVar1);
  anon_unknown_13::addChildVariants<deqp::gles2::Functional::FboCases::TexSubImageBetweenRenderTest>
            (pTVar1);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "repeated_clear","Repeated FBO clears");
  tcu::TestNode::addChild((TestNode *)this,node);
  pTVar2 = (TestNode *)operator_new(0x90);
  FboCases::RepeatedClearCase::RepeatedClearCase
            ((RepeatedClearCase *)pTVar2,(this->super_TestCaseGroup).m_context,0x1907);
  tcu::TestNode::addChild(node,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  FboCases::RepeatedClearCase::RepeatedClearCase
            ((RepeatedClearCase *)pTVar2,(this->super_TestCaseGroup).m_context,0x1908);
  tcu::TestNode::addChild(node,pTVar2);
  return extraout_EAX;
}

Assistant:

void FboRenderTestGroup::init (void)
{
	createChildGroup<FboCases::ColorClearsTest>					(this, "color_clear",		"Color buffer clears");
	createChildGroup<FboCases::StencilClearsTest>				(this, "stencil_clear",		"Stencil buffer clears");

	deqp::gles2::TestCaseGroup* colorGroup = new deqp::gles2::TestCaseGroup(m_context, "color", "Color buffer tests");
	addChild(colorGroup);
	addChildVariants<FboCases::MixTest>			(colorGroup);
	addChildVariants<FboCases::MixNpotTest>		(colorGroup);
	addChildVariants<FboCases::BlendTest>		(colorGroup);
	addChildVariants<FboCases::BlendNpotTest>	(colorGroup);

	deqp::gles2::TestCaseGroup* depthGroup = new deqp::gles2::TestCaseGroup(m_context, "depth", "Depth bufer tests");
	addChild(depthGroup);
	addChildVariants<FboCases::IntersectingQuadsTest>		(depthGroup);
	addChildVariants<FboCases::IntersectingQuadsNpotTest>	(depthGroup);

	deqp::gles2::TestCaseGroup* stencilGroup = new deqp::gles2::TestCaseGroup(m_context, "stencil", "Stencil buffer tests");
	addChild(stencilGroup);
	addChildVariants<FboCases::StencilTest>		(stencilGroup);
	addChildVariants<FboCases::StencilNpotTest>	(stencilGroup);

	createChildGroup<FboCases::SharedColorbufferClearsTest>		(this, "shared_colorbuffer_clear",	"Shared colorbuffer clears");
	createChildGroup<FboCases::SharedColorbufferTest>			(this, "shared_colorbuffer",		"Shared colorbuffer tests");
	createChildGroup<FboCases::SharedDepthbufferTest>			(this, "shared_depthbuffer",		"Shared depthbuffer tests");
	createChildGroup<FboCases::ResizeTest>						(this, "resize",					"FBO resize tests");

	createRecreateBuffersGroup<GL_COLOR_BUFFER_BIT>				(this, "recreate_colorbuffer",		"Recreate colorbuffer tests");
	createRecreateBuffersGroup<GL_DEPTH_BUFFER_BIT>				(this, "recreate_depthbuffer",		"Recreate depthbuffer tests");
	createRecreateBuffersGroup<GL_STENCIL_BUFFER_BIT>			(this, "recreate_stencilbuffer",	"Recreate stencilbuffer tests");

	deqp::gles2::TestCaseGroup* texSubImageGroup = new deqp::gles2::TestCaseGroup(m_context, "texsubimage", "TexSubImage interop with FBO colorbuffer texture");
	addChild(texSubImageGroup);
	addChildVariants<FboCases::TexSubImageAfterRenderTest>		(texSubImageGroup);
	addChildVariants<FboCases::TexSubImageBetweenRenderTest>	(texSubImageGroup);

	{
		tcu::TestCaseGroup* const repeatedClearGroup = new tcu::TestCaseGroup(m_testCtx, "repeated_clear", "Repeated FBO clears");
		addChild(repeatedClearGroup);

		repeatedClearGroup->addChild(new FboCases::RepeatedClearCase(m_context, GL_RGB));
		repeatedClearGroup->addChild(new FboCases::RepeatedClearCase(m_context, GL_RGBA));
	}
}